

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

bigint<13> * __thiscall bigint<13>::add<13,1>(bigint<13> *this,bigint<13> *x,bigint<1> *y)

{
  int iVar1;
  uint uVar2;
  uint local_48;
  uint local_40;
  int local_2c;
  int i;
  int maxlen;
  dbldigit carry;
  bigint<1> *y_local;
  bigint<13> *x_local;
  bigint<13> *this_local;
  
  i = 0;
  iVar1 = max<int>(x->len,y->len);
  for (local_2c = 0; local_2c < y->len || i != 0; local_2c = local_2c + 1) {
    if (local_2c < x->len) {
      local_40 = (uint)x->digits[local_2c];
    }
    else {
      local_40 = 0;
    }
    if (local_2c < y->len) {
      local_48 = (uint)y->digits[local_2c];
    }
    else {
      local_48 = 0;
    }
    uVar2 = local_40 + local_48 + i;
    this->digits[local_2c] = (digit)uVar2;
    i = uVar2 >> 0x10;
  }
  if ((local_2c < x->len) && (this != x)) {
    memcpy(this->digits + local_2c,x->digits + local_2c,(long)(x->len - local_2c) << 1);
  }
  iVar1 = max<int>(local_2c,iVar1);
  this->len = iVar1;
  return this;
}

Assistant:

bigint &add(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        dbldigit carry = 0;
        int maxlen = max(x.len, y.len), i;
        for(i = 0; i < y.len || carry; i++)
        {
             carry += (i < x.len ? (dbldigit)x.digits[i] : 0) + (i < y.len ? (dbldigit)y.digits[i] : 0);
             digits[i] = (digit)carry;
             carry >>= BI_DIGIT_BITS;
        }
        if(i < x.len && this != &x) memcpy(&digits[i], &x.digits[i], (x.len - i)*sizeof(digit));
        len = max(i, maxlen);
        return *this;
    }